

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void QJsonPrivate::Writer::arrayToJson
               (QCborContainerPrivate *a,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  QByteArray *json_00;
  qsizetype qVar2;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  QCborContainerPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  json_00 = (QByteArray *)QByteArray::size(in_RSI);
  if (in_RDI == 0) {
    uVar3 = 0x10;
  }
  else {
    qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RDI + 0x28));
    uVar3 = (undefined4)qVar2;
  }
  QByteArray::reserve((QByteArray *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                      (qsizetype)in_stack_ffffffffffffffb8);
  QByteArray::operator+=(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  arrayContentToJson(in_stack_ffffffffffffffb8,json_00,(int)((ulong)in_RSI >> 0x20),
                     SUB81((ulong)in_RSI >> 0x18,0));
  QByteArray::QByteArray
            ((QByteArray *)in_stack_ffffffffffffffb8,(qsizetype)json_00,
             (char)((ulong)in_RSI >> 0x38));
  QByteArray::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QByteArray::~QByteArray((QByteArray *)0x4a4667);
  QByteArray::operator+=(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Writer::arrayToJson(const QCborContainerPrivate *a, QByteArray &json, int indent, bool compact)
{
    json.reserve(json.size() + (a ? (int)a->elements.size() : 16));
    json += compact ? "[" : "[\n";
    arrayContentToJson(a, json, indent + (compact ? 0 : 1), compact);
    json += QByteArray(4*indent, ' ');
    json += compact ? "]" : "]\n";
}